

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::TablePrinter::close(TablePrinter *this,int __fd)

{
  undefined4 in_register_00000034;
  TablePrinter *this_local;
  
  if ((this->m_isOpen & 1U) != 0) {
    Catch::operator<<(this,CONCAT44(in_register_00000034,__fd));
    std::ostream::operator<<(this->m_os,std::endl<char,std::char_traits<char>>);
    this->m_isOpen = false;
  }
  return (int)this;
}

Assistant:

void close() {
            if (m_isOpen) {
                *this << RowBreak();
                m_os << std::endl;
                m_isOpen = false;
            }
        }